

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O1

int __thiscall
BlockDevice::ScsiCmd
          (BlockDevice *this,int fd,uint8_t *cmd,int cmd_len,void *data,int data_len,bool read)

{
  int iVar1;
  sg_io_hdr io_hdr;
  undefined1 auStack_88 [32];
  undefined4 local_68;
  int iStack_64;
  undefined8 uStack_60;
  void *local_58;
  uint8_t *puStack_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ulong local_18;
  
  local_48 = auStack_88;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_18 = 0;
  _local_68 = CONCAT44(-2 - (uint)read,0x53);
  uStack_60._0_2_ = CONCAT11(0x20,(char)cmd_len);
  uStack_60 = CONCAT62((int6)(CONCAT44(data_len,cmd_len) >> 0x10),(undefined2)uStack_60) &
              0xffffffff0000ffff;
  uStack_40 = 5000;
  local_58 = data;
  puStack_50 = cmd;
  iVar1 = ioctl(fd,0x2285,&local_68);
  if ((-1 < iVar1) && ((!read || (iVar1 = -0x26, (local_18 & 1) == 0)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int BlockDevice::ScsiCmd(int fd, const uint8_t* cmd, int cmd_len, void* data, int data_len, bool read)
{
#if defined(HAVE_SCSI_SCSI_H) && defined(HAVE_SCSI_SG_H)
    uint8_t sense[32];

    struct sg_io_hdr io_hdr = {};
    io_hdr.interface_id = 'S';
    io_hdr.cmdp = const_cast<uint8_t*>(cmd);
    io_hdr.cmd_len = cmd_len;
    io_hdr.dxferp = data;
    io_hdr.dxfer_len = data_len;
    io_hdr.dxfer_direction = read ? SG_DXFER_FROM_DEV : SG_DXFER_TO_DEV;
    io_hdr.sbp = sense;
    io_hdr.mx_sb_len = sizeof(sense);
    io_hdr.timeout = 5000;

    auto ret = ioctl(fd, SG_IO, &io_hdr);
    if (ret < 0)
        return ret;

    if (read && (io_hdr.info & SG_INFO_OK_MASK) != SG_INFO_OK)
        return -ENOSYS;

    return 0;
#else
    (void)fd; (void)cmd; (void)cmd_len; (void)data; (void)data_len; (void)read;
    return -ENOTSUP;
#endif // HAVE_SCSI_SCSI_H && HAVE_SCSI_SG_H
}